

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lyd_node * lyd_create_leaf(lys_node *schema,char *val_str,int dflt)

{
  int iVar1;
  lyd_node *plVar2;
  lyd_node *plVar3;
  LY_ERR *pLVar4;
  char *value;
  
  plVar2 = (lyd_node *)calloc(1,0x48);
  if (plVar2 == (lyd_node *)0x0) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EMEM;
    plVar2 = (lyd_node *)0x0;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_create_leaf");
  }
  else {
    plVar2->schema = schema;
    iVar1 = ly_new_node_validity(schema);
    plVar2->validity = (uint8_t)iVar1;
    iVar1 = resolve_applies_when(schema,0,(lys_node *)0x0);
    if (iVar1 != 0) {
      plVar2->field_0x9 = plVar2->field_0x9 & 0xf1 | 8;
    }
    plVar2->prev = plVar2;
    *(uint16_t *)&plVar2[1].validity = schema[1].flags;
    value = "";
    if (val_str != (char *)0x0) {
      value = val_str;
    }
    plVar3 = (lyd_node *)lydict_insert(schema->module->ctx,value,0);
    plVar2->child = plVar3;
    plVar2->field_0x9 = plVar2->field_0x9 & 0xfe | (byte)dflt & 1;
  }
  return plVar2;
}

Assistant:

static struct lyd_node *
lyd_create_leaf(const struct lys_node *schema, const char *val_str, int dflt)
{
    struct lyd_node_leaf_list *ret;

    ret = calloc(1, sizeof *ret);
    if (!ret) {
        LOGMEM;
        return NULL;
    }
    ret->schema = (struct lys_node *)schema;
    ret->validity = ly_new_node_validity(schema);
    if (resolve_applies_when(schema, 0, NULL)) {
        ret->when_status = LYD_WHEN;
    }
    ret->prev = (struct lyd_node *)ret;
    ret->value_type = ((struct lys_node_leaf *)schema)->type.base;
    ret->value_str = lydict_insert(schema->module->ctx, val_str ? val_str : "", 0);
    ret->dflt = dflt;

    return (struct lyd_node *)ret;
}